

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

Value * __thiscall toml::Value::setChild(Value *this,string *key,Value *v)

{
  bool bVar1;
  mapped_type *pmVar2;
  Value *in_RDX;
  Value *in_RDI;
  char (*in_stack_00000140) [38];
  Value *in_stack_ffffffffffffff80;
  Value *in_stack_ffffffffffffff88;
  Value *in_stack_ffffffffffffffa0;
  Value local_58;
  key_type *in_stack_ffffffffffffffb8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  *in_stack_ffffffffffffffc0;
  
  bVar1 = valid(in_RDI);
  if (!bVar1) {
    in_stack_ffffffffffffffb8 = (key_type *)0x0;
    in_stack_ffffffffffffffc0 =
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
          *)0x0;
    local_58.type_ = NULL_TYPE;
    local_58._4_4_ = 0;
    local_58.field_1.null_ = (void *)0x0;
    in_stack_ffffffffffffff88 = &local_58;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
           *)0x1834a0);
    Value(in_RDI,(Table *)in_stack_ffffffffffffff88);
    operator=(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    ~Value(in_stack_ffffffffffffffa0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
            *)0x1834d4);
  }
  bVar1 = is<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                    (in_stack_ffffffffffffff80);
  if (!bVar1) {
    failwith<char_const(&)[38]>(in_stack_00000140);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  operator=(in_stack_ffffffffffffff88,in_RDX);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
           ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return pmVar2;
}

Assistant:

inline Value* Value::setChild(const std::string& key, Value&& v)
{
    if (!valid())
        *this = Value((Table()));

    if (!is<Table>())
        failwith("type must be table to do set(key, v).");

    (*table_)[key] = std::move(v);
    return &(*table_)[key];
}